

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::MapAndSetParamClosureRegister(FunctionBody *this,RegSlot reg)

{
  code *pcVar1;
  bool bVar2;
  RegSlot reg_00;
  undefined4 *puVar3;
  
  if ((this->field_0x17c & 4) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x25f5,"(!m_hasParamClosureRegister)","!m_hasParamClosureRegister")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  reg_00 = MapRegSlot(this,reg);
  SetParamClosureRegister(this,reg_00);
  return;
}

Assistant:

void FunctionBody::MapAndSetParamClosureRegister(RegSlot reg)
    {
        Assert(!m_hasParamClosureRegister);
        SetParamClosureRegister(this->MapRegSlot(reg));
    }